

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::str_writer<fmt::v5::char8_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
           *this,align_spec *spec,str_writer<fmt::v5::char8_t> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  size_t __n;
  size_t __n_00;
  basic_buffer<fmt::v5::char8_t> *c;
  char8_t *__src;
  ptrdiff_t _Num_3;
  ulong uVar6;
  ptrdiff_t _Num_2;
  size_t size;
  void *pvVar7;
  void *__dest;
  ulong uVar8;
  basic_string_view<fmt::v5::char8_t> s;
  
  uVar8 = (ulong)spec->width_;
  uVar6 = f->size_;
  uVar5 = uVar6;
  if (uVar8 != 0) {
    s.size_ = uVar6;
    s.data_ = f->s;
    uVar5 = internal::count_code_points(s);
  }
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n_00 = uVar8 - uVar5;
  if (uVar8 < uVar5 || __n_00 == 0) {
    uVar6 = uVar6 + lVar3;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
    }
    puVar2[2] = uVar6;
    __n = f->size_;
    if (__n == 0) {
      return;
    }
    pvVar7 = (void *)(lVar3 + puVar2[1]);
    __src = f->s;
LAB_0020ee8e:
    memmove(pvVar7,__src,__n);
    return;
  }
  uVar6 = ((uVar6 + uVar8) - uVar5) + lVar3;
  if ((ulong)puVar2[3] < uVar6) {
    (**(code **)*puVar2)(puVar2,uVar6);
  }
  puVar2[2] = uVar6;
  pvVar7 = (void *)(lVar3 + puVar2[1]);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar6 = __n_00 >> 1;
    __dest = pvVar7;
    if (1 < __n_00) {
      __dest = (void *)((long)pvVar7 + uVar6);
      memset(pvVar7,(uint)bVar1,uVar6);
    }
    sVar4 = f->size_;
    if (sVar4 != 0) {
      memmove(__dest,f->s,sVar4);
    }
    __n_00 = __n_00 - uVar6;
    pvVar7 = (void *)((long)__dest + sVar4);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      memset(pvVar7,(uint)bVar1,__n_00);
      __n = f->size_;
      if (__n == 0) {
        return;
      }
      pvVar7 = (void *)((long)pvVar7 + __n_00);
      __src = f->s;
      goto LAB_0020ee8e;
    }
    sVar4 = f->size_;
    if (sVar4 != 0) {
      memmove(pvVar7,f->s,sVar4);
    }
    pvVar7 = (void *)((long)pvVar7 + sVar4);
  }
  memset(pvVar7,(uint)bVar1,__n_00);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }